

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O3

int __thiscall xercesc_4_0::XMLDateTime::fillYearString(XMLDateTime *this,XMLCh **ptr,int value)

{
  ulong uVar1;
  short *psVar2;
  int iVar3;
  XMLCh *pXVar4;
  ulong uVar5;
  long lVar6;
  XMLCh strBuffer [16];
  XMLCh local_28 [16];
  
  XMLString::binToText(value,local_28,0xf,10,this->fMemoryManager);
  lVar6 = 0;
  do {
    psVar2 = (short *)((long)local_28 + lVar6);
    lVar6 = lVar6 + 2;
  } while (*psVar2 != 0);
  uVar1 = (lVar6 >> 1) - 1;
  pXVar4 = *ptr;
  if (local_28[0] == L'-') {
    *ptr = pXVar4 + 1;
    *pXVar4 = L'-';
    pXVar4 = pXVar4 + 1;
  }
  uVar5 = (ulong)(local_28[0] == L'-');
  if ((uVar5 + uVar1 < 4) && (lVar6 = (uVar5 - (lVar6 >> 1)) + 5, lVar6 != 0)) {
    do {
      *pXVar4 = L'0';
      pXVar4 = pXVar4 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    *ptr = pXVar4;
  }
  if (uVar5 < uVar1) {
    do {
      *pXVar4 = local_28[uVar5];
      pXVar4 = pXVar4 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    *ptr = pXVar4;
  }
  iVar3 = 0;
  if (4 < uVar1) {
    iVar3 = (int)uVar1 + -4;
  }
  return iVar3;
}

Assistant:

int XMLDateTime::fillYearString(XMLCh*& ptr, int value) const
{
    XMLCh strBuffer[16];
    // let's hope we get no years of 15 digits...
    XMLString::binToText(value, strBuffer, 15, 10, fMemoryManager);
    XMLSize_t actualLen = XMLString::stringLen(strBuffer);
    // don't forget that years can be negative...
    XMLSize_t negativeYear = 0;
    if(strBuffer[0] == chDash)
    {
        *ptr++ = strBuffer[0];
        negativeYear = 1;
    }
    XMLSize_t i;
    //append leading zeros
    if(actualLen+negativeYear < 4)
        for (i = 0; i < 4 - actualLen+negativeYear; i++)
            *ptr++ = chDigit_0;

    for (i = negativeYear; i < actualLen; i++)
        *ptr++ = strBuffer[i];

    if(actualLen > 4)
        return (int)actualLen-4;
    return 0;
}